

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2StartElement(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlChar **val_01;
  int local_3c;
  int n_atts;
  xmlChar **atts;
  int n_fullname;
  xmlChar *fullname;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (fullname._4_4_ = 0; (int)fullname._4_4_ < 2; fullname._4_4_ = fullname._4_4_ + 1) {
    for (atts._4_4_ = 0; (int)atts._4_4_ < 5; atts._4_4_ = atts._4_4_ + 1) {
      for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_void_ptr(fullname._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(atts._4_4_,1);
        val_01 = gen_const_xmlChar_ptr_ptr(local_3c,2);
        xmlSAX2StartElement(val,val_00,val_01);
        call_tests = call_tests + 1;
        des_void_ptr(fullname._4_4_,val,0);
        des_const_xmlChar_ptr(atts._4_4_,val_00,1);
        des_const_xmlChar_ptr_ptr(local_3c,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2StartElement",(ulong)(uint)(iVar2 - iVar1));
          ctx._4_4_ = ctx._4_4_ + 1;
          printf(" %d",(ulong)fullname._4_4_);
          printf(" %d",(ulong)atts._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2StartElement(void) {
    int test_ret = 0;

#ifdef LIBXML_SAX1_ENABLED
    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * fullname; /* The element name, including namespace prefix */
    int n_fullname;
    const xmlChar ** atts; /* An array of name/value attributes pairs, NULL terminated */
    int n_atts;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_fullname = 0;n_fullname < gen_nb_const_xmlChar_ptr;n_fullname++) {
    for (n_atts = 0;n_atts < gen_nb_const_xmlChar_ptr_ptr;n_atts++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        fullname = gen_const_xmlChar_ptr(n_fullname, 1);
        atts = gen_const_xmlChar_ptr_ptr(n_atts, 2);

        xmlSAX2StartElement(ctx, fullname, atts);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_fullname, fullname, 1);
        des_const_xmlChar_ptr_ptr(n_atts, atts, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2StartElement",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_fullname);
            printf(" %d", n_atts);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}